

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconnect.cpp
# Opt level: O2

void __thiscall
ReconnectingHub::connectionClosed(ReconnectingHub *this,Stream *stream,bool abnormal)

{
  ostream *poVar1;
  string local_40;
  
  this->connected = false;
  poVar1 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar1 = std::operator<<(poVar1,"Lost connection to ");
  Dashel::Stream::getTargetName_abi_cxx11_(&local_40,stream);
  std::operator<<(poVar1,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if (abnormal) {
    poVar1 = std::operator<<((ostream *)&std::cout," : ");
    std::operator<<(poVar1,(string *)(stream + 0x10));
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return;
}

Assistant:

virtual void connectionClosed(Stream* stream, bool abnormal)
	{
		connected = false;
		cout << endl
			 << "Lost connection to " << stream->getTargetName();
		if (abnormal)
			cout << " : " << stream->getFailReason();
		cout << endl;
	}